

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

int __thiscall asl::Array<asl::Xml>::remove(Array<asl::Xml> *this,char *__filename)

{
  long *plVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  Xml *pXVar5;
  int in_EDX;
  long lVar6;
  
  pXVar5 = this->_a;
  iVar2 = *(int *)&pXVar5[-2].super_NodeBase._p;
  iVar4 = (int)__filename;
  if (in_EDX + iVar4 <= iVar2) {
    if (in_EDX != 0) {
      lVar6 = 0;
      do {
        plVar3 = *(long **)((long)&pXVar5[iVar4].super_NodeBase._p + lVar6);
        if (plVar3 != (long *)0x0) {
          plVar1 = plVar3 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          if ((int)*plVar1 == 0) {
            (**(code **)(*plVar3 + 8))();
          }
        }
        lVar6 = lVar6 + 8;
      } while ((long)in_EDX * 8 - lVar6 != 0);
      pXVar5 = this->_a;
    }
    memmove(pXVar5 + iVar4,pXVar5 + iVar4 + in_EDX,(long)(iVar2 - (in_EDX + iVar4)) << 3);
    *(int *)&this->_a[-2].super_NodeBase._p = *(int *)&this->_a[-2].super_NodeBase._p - in_EDX;
    resize(this,iVar2 - in_EDX);
  }
  return (int)this;
}

Assistant:

Array& remove(int i, int n = 1)
	{
		int m = d().n;
		if (i + n > m)
			return *this;
		asl_destroy(_a+i, n);
		memmove((char*)(_a + i), _a + i + n, (m - i - n)*sizeof(T));
		d().n -= n;
		resize(m - n);
		return *this;
	}